

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O0

RPCHelpMan * getblockchaininfo(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  bool bVar1;
  RPCHelpMan *in_RDI;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffe9f8;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar3;
  allocator<RPCResult> *this;
  RPCResult *this_00;
  anon_class_1_0_00000001 *in_stack_ffffffffffffea00;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffea08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea30;
  allocator<char> *in_stack_ffffffffffffea38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffea40;
  undefined7 in_stack_ffffffffffffea48;
  undefined1 in_stack_ffffffffffffea4f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_ffffffffffffea50;
  string *in_stack_ffffffffffffea58;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_ffffffffffffea60;
  undefined1 *puVar4;
  string *in_stack_ffffffffffffea68;
  RPCResult *in_stack_ffffffffffffea70;
  RPCResult *in_stack_ffffffffffffea78;
  RPCResult *in_stack_ffffffffffffea80;
  RPCExamples *examples;
  pointer *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_01;
  RPCMethodImpl *fun;
  bool local_12e9;
  bool local_12e6;
  undefined1 local_1280 [35];
  allocator<char> local_125d;
  allocator<char> local_125c;
  allocator<char> local_125b [3];
  pointer local_1258;
  pointer pRStack_1250;
  pointer local_1248;
  allocator<char> local_123a;
  allocator<char> local_1239 [31];
  allocator<char> local_121a;
  allocator<char> local_1219;
  _Alloc_hider local_1218;
  size_type sStack_1210;
  undefined1 local_1208 [14];
  allocator<char> local_11fa;
  allocator<char> local_11f9;
  undefined8 local_11f8;
  undefined8 uStack_11f0;
  undefined8 local_11e8;
  allocator<char> local_11da;
  allocator<char> local_11d9;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined1 local_11ba;
  undefined1 local_11b9 [9];
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined1 local_119a [2];
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  allocator<char> local_117a;
  allocator<char> local_1179;
  undefined8 local_1178;
  undefined8 uStack_1170;
  undefined8 local_1168;
  allocator<char> local_115a;
  allocator<char> local_1159;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  allocator<char> local_113a;
  allocator<char> local_1139;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  allocator<char> local_111a;
  allocator<char> local_1119;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  allocator<char> local_10fa;
  allocator<char> local_10f9;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  undefined8 local_10e8;
  allocator<char> local_10d9;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  allocator<char> local_10b9;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  allocator<char> local_109a;
  undefined1 local_1099 [32];
  allocator<char> local_1079;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  allocator<char> local_105a;
  allocator<char> local_1059;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  allocator<char> local_103a;
  allocator<char> local_1039;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  allocator<char> local_1012;
  allocator<char> local_1011 [17];
  undefined8 local_1000;
  allocator<char> local_ff2;
  allocator<char> local_ff1 [25];
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  allocator<char> local_fba;
  allocator<char> local_fb9 [321];
  undefined1 local_e78 [136];
  undefined1 local_df0 [1120];
  undefined1 local_990 [1632];
  RPCHelpMan local_330 [2];
  undefined1 local_110 [264];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  local_fd8 = 0;
  uStack_fd0 = 0;
  local_fc8 = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector(in_stack_ffffffffffffe9f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  local_1038 = 0;
  uStack_1030 = 0;
  local_1028 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9f8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea80,(Type)((ulong)in_stack_ffffffffffffea78 >> 0x20),
             (string *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea60
             ,SUB81((ulong)in_stack_ffffffffffffea58 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  local_1058 = 0;
  uStack_1050 = 0;
  local_1048 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9f8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea80,(Type)((ulong)in_stack_ffffffffffffea78 >> 0x20),
             (string *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea60
             ,SUB81((ulong)in_stack_ffffffffffffea58 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  local_1078 = 0;
  uStack_1070 = 0;
  local_1068 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9f8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea80,(Type)((ulong)in_stack_ffffffffffffea78 >> 0x20),
             (string *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea60
             ,SUB81((ulong)in_stack_ffffffffffffea58 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  local_1099._1_8_ = 0;
  local_1099._9_8_ = 0;
  local_1099._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9f8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea80,(Type)((ulong)in_stack_ffffffffffffea78 >> 0x20),
             (string *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea60
             ,SUB81((ulong)in_stack_ffffffffffffea58 >> 0x38,0));
  fun = (RPCMethodImpl *)local_1099;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  local_10b8 = 0;
  uStack_10b0 = 0;
  local_10a8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9f8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea80,(Type)((ulong)in_stack_ffffffffffffea78 >> 0x20),
             (string *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea60
             ,SUB81((ulong)in_stack_ffffffffffffea58 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
                 in_stack_ffffffffffffea40);
  local_10d8 = 0;
  uStack_10d0 = 0;
  local_10c8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9f8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea80,(Type)((ulong)in_stack_ffffffffffffea78 >> 0x20),
             (string *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea60
             ,SUB81((ulong)in_stack_ffffffffffffea58 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
                 in_stack_ffffffffffffea40);
  local_10f8 = 0;
  uStack_10f0 = 0;
  local_10e8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9f8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea80,(Type)((ulong)in_stack_ffffffffffffea78 >> 0x20),
             (string *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea60
             ,SUB81((ulong)in_stack_ffffffffffffea58 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  local_1118 = 0;
  uStack_1110 = 0;
  local_1108 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9f8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea80,(Type)((ulong)in_stack_ffffffffffffea78 >> 0x20),
             (string *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea60
             ,SUB81((ulong)in_stack_ffffffffffffea58 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  local_1138 = 0;
  uStack_1130 = 0;
  local_1128 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9f8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea80,(Type)((ulong)in_stack_ffffffffffffea78 >> 0x20),
             (string *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea60
             ,SUB81((ulong)in_stack_ffffffffffffea58 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  local_1158 = 0;
  uStack_1150 = 0;
  local_1148 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9f8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea80,(Type)((ulong)in_stack_ffffffffffffea78 >> 0x20),
             (string *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea60
             ,SUB81((ulong)in_stack_ffffffffffffea58 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  local_1178 = 0;
  uStack_1170 = 0;
  local_1168 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9f8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea80,(Type)((ulong)in_stack_ffffffffffffea78 >> 0x20),
             (string *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea60
             ,SUB81((ulong)in_stack_ffffffffffffea58 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  local_1198 = 0;
  uStack_1190 = 0;
  local_1188 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9f8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea80,(Type)((ulong)in_stack_ffffffffffffea78 >> 0x20),
             (string *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea60
             ,SUB81((ulong)in_stack_ffffffffffffea58 >> 0x38,0));
  this_01 = local_330;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  name = (string *)local_119a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  local_11b9._1_8_ = 0;
  uStack_11b0 = 0;
  local_11a8 = 0;
  description = (string *)(local_11b9 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe9f8);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)
           ((ulong)in_stack_ffffffffffffe9f8 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea78,(Type)((ulong)in_stack_ffffffffffffea70 >> 0x20),
             in_stack_ffffffffffffea68,SUB81((ulong)in_stack_ffffffffffffea60 >> 0x38,0),
             in_stack_ffffffffffffea58,in_stack_ffffffffffffea50,(bool)in_stack_ffffffffffffea4f);
  results = (pointer *)
            ((long)&local_330[0].m_results.m_results.
                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data + 0x10);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)local_11b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  examples = (RPCExamples *)&local_11ba;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  local_11d8 = 0;
  uStack_11d0 = 0;
  local_11c8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea78,(Type)((ulong)in_stack_ffffffffffffea70 >> 0x20),
             in_stack_ffffffffffffea68,SUB81((ulong)in_stack_ffffffffffffea60 >> 0x38,0),
             in_stack_ffffffffffffea58,in_stack_ffffffffffffea50,(bool)in_stack_ffffffffffffea4f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  local_11f8 = 0;
  uStack_11f0 = 0;
  local_11e8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  this = (allocator<RPCResult> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea78,(Type)((ulong)in_stack_ffffffffffffea70 >> 0x20),
             in_stack_ffffffffffffea68,SUB81((ulong)in_stack_ffffffffffffea60 >> 0x38,0),
             in_stack_ffffffffffffea58,in_stack_ffffffffffffea50,(bool)in_stack_ffffffffffffea4f);
  skip_type_check = (undefined1)((ulong)in_stack_ffffffffffffea58 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  bVar1 = IsDeprecatedRPCEnabled
                    ((string *)CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
               (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
               (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
    local_1218._M_p = (pointer)0x0;
    sStack_1210 = 0;
    local_1208._0_8_ = 0;
    std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
    RPCResult::RPCResult
              (in_stack_ffffffffffffea80,(Type)((ulong)in_stack_ffffffffffffea78 >> 0x20),
               (string *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,
               in_stack_ffffffffffffea60,(bool)skip_type_check);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
               (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
               (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
               (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
               (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
    local_1258 = (pointer)0x0;
    pRStack_1250 = (pointer)0x0;
    local_1248 = (pointer)0x0;
    std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
    RPCResult::RPCResult
              (in_stack_ffffffffffffea80,(Type)((ulong)in_stack_ffffffffffffea78 >> 0x20),
               (string *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,
               in_stack_ffffffffffffea60,(bool)skip_type_check);
    std::allocator<RPCResult>::allocator(this);
    __l._M_len._0_7_ = in_stack_ffffffffffffea48;
    __l._M_array = (iterator)in_stack_ffffffffffffea40;
    __l._M_len._7_1_ = in_stack_ffffffffffffea4f;
    std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea38,__l,
               (allocator_type *)in_stack_ffffffffffffea30);
    RPCResult::RPCResult
              (in_stack_ffffffffffffea80,(Type)((ulong)in_stack_ffffffffffffea78 >> 0x20),
               (string *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,
               in_stack_ffffffffffffea60,(bool)skip_type_check);
  }
  local_12e9 = !bVar1;
  std::allocator<RPCResult>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffea48;
  __l_00._M_array = (iterator)in_stack_ffffffffffffea40;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffea4f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea38,__l_00,
             (allocator_type *)in_stack_ffffffffffffea30);
  RPCResult::RPCResult
            (in_stack_ffffffffffffea80,(Type)((ulong)in_stack_ffffffffffffea78 >> 0x20),
             (string *)in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,in_stack_ffffffffffffea60
             ,(bool)skip_type_check);
  RPCResults::RPCResults((RPCResults *)in_stack_ffffffffffffea78,in_stack_ffffffffffffea70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  HelpExampleCli(in_stack_ffffffffffffea30,in_stack_ffffffffffffea28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffea4f,in_stack_ffffffffffffea48),
             (char *)in_stack_ffffffffffffea40,in_stack_ffffffffffffea38);
  HelpExampleRpc(in_stack_ffffffffffffea30,in_stack_ffffffffffffea28);
  std::operator+(in_stack_ffffffffffffea30,in_stack_ffffffffffffea28);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x53fef3);
  this_00 = (RPCResult *)local_1280;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getblockchaininfo()::__0,void>(in_stack_ffffffffffffea08,in_stack_ffffffffffffea00);
  RPCHelpMan::RPCHelpMan(this_01,name,description,args,(RPCResults *)results,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)(local_1280 + 0x22));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_125d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_125c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_125b);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult(this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  puVar4 = local_990;
  puVar2 = local_110;
  do {
    puVar2 = puVar2 + -0x88;
    RPCResult::~RPCResult(this_00);
  } while (puVar2 != puVar4);
  if (local_12e9) {
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
    std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
    puVar4 = local_e78;
    puVar2 = local_df0;
    do {
      puVar2 = puVar2 + -0x88;
      RPCResult::~RPCResult(this_00);
    } while (puVar2 != puVar4);
  }
  if (bVar1) {
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::allocator<char>::~allocator((allocator<char> *)(local_1208 + 0xd));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::allocator<char>::~allocator(&local_11fa);
  }
  else {
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::allocator<char>::~allocator(&local_123a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::allocator<char>::~allocator(local_1239);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::allocator<char>::~allocator(&local_121a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::allocator<char>::~allocator(&local_1219);
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_11f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_11da);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_11d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&local_11ba);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_11b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_119a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)(local_119a + 1));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_117a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_1179);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_115a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_1159);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_113a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_1139);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_111a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_1119);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_10fa);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_10f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_10d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_10b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_109a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_1099);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)(local_1099 + 0x1f));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_1079);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_105a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_1059);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_103a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_1039);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffea08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_1012);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_1011);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_ff2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_ff1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffea08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_fba);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_fb9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan getblockchaininfo()
{
    return RPCHelpMan{"getblockchaininfo",
        "Returns an object containing various state info regarding blockchain processing.\n",
        {},
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "chain", "current network name (" LIST_CHAIN_NAMES ")"},
                {RPCResult::Type::NUM, "blocks", "the height of the most-work fully-validated chain. The genesis block has height 0"},
                {RPCResult::Type::NUM, "headers", "the current number of headers we have validated"},
                {RPCResult::Type::STR, "bestblockhash", "the hash of the currently best block"},
                {RPCResult::Type::NUM, "difficulty", "the current difficulty"},
                {RPCResult::Type::NUM_TIME, "time", "The block time expressed in " + UNIX_EPOCH_TIME},
                {RPCResult::Type::NUM_TIME, "mediantime", "The median block time expressed in " + UNIX_EPOCH_TIME},
                {RPCResult::Type::NUM, "verificationprogress", "estimate of verification progress [0..1]"},
                {RPCResult::Type::BOOL, "initialblockdownload", "(debug information) estimate of whether this node is in Initial Block Download mode"},
                {RPCResult::Type::STR_HEX, "chainwork", "total amount of work in active chain, in hexadecimal"},
                {RPCResult::Type::NUM, "size_on_disk", "the estimated size of the block and undo files on disk"},
                {RPCResult::Type::BOOL, "pruned", "if the blocks are subject to pruning"},
                {RPCResult::Type::NUM, "pruneheight", /*optional=*/true, "height of the last block pruned, plus one (only present if pruning is enabled)"},
                {RPCResult::Type::BOOL, "automatic_pruning", /*optional=*/true, "whether automatic pruning is enabled (only present if pruning is enabled)"},
                {RPCResult::Type::NUM, "prune_target_size", /*optional=*/true, "the target size used by pruning (only present if automatic pruning is enabled)"},
                (IsDeprecatedRPCEnabled("warnings") ?
                    RPCResult{RPCResult::Type::STR, "warnings", "any network and blockchain warnings (DEPRECATED)"} :
                    RPCResult{RPCResult::Type::ARR, "warnings", "any network and blockchain warnings (run with `-deprecatedrpc=warnings` to return the latest warning as a single string)",
                    {
                        {RPCResult::Type::STR, "", "warning"},
                    }
                    }
                ),
            }},
        RPCExamples{
            HelpExampleCli("getblockchaininfo", "")
            + HelpExampleRpc("getblockchaininfo", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    ChainstateManager& chainman = EnsureAnyChainman(request.context);
    LOCK(cs_main);
    Chainstate& active_chainstate = chainman.ActiveChainstate();

    const CBlockIndex& tip{*CHECK_NONFATAL(active_chainstate.m_chain.Tip())};
    const int height{tip.nHeight};
    UniValue obj(UniValue::VOBJ);
    obj.pushKV("chain", chainman.GetParams().GetChainTypeString());
    obj.pushKV("blocks", height);
    obj.pushKV("headers", chainman.m_best_header ? chainman.m_best_header->nHeight : -1);
    obj.pushKV("bestblockhash", tip.GetBlockHash().GetHex());
    obj.pushKV("difficulty", GetDifficulty(tip));
    obj.pushKV("time", tip.GetBlockTime());
    obj.pushKV("mediantime", tip.GetMedianTimePast());
    obj.pushKV("verificationprogress", GuessVerificationProgress(chainman.GetParams().TxData(), &tip));
    obj.pushKV("initialblockdownload", chainman.IsInitialBlockDownload());
    obj.pushKV("chainwork", tip.nChainWork.GetHex());
    obj.pushKV("size_on_disk", chainman.m_blockman.CalculateCurrentUsage());
    obj.pushKV("pruned", chainman.m_blockman.IsPruneMode());
    if (chainman.m_blockman.IsPruneMode()) {
        const auto prune_height{GetPruneHeight(chainman.m_blockman, active_chainstate.m_chain)};
        obj.pushKV("pruneheight", prune_height ? prune_height.value() + 1 : 0);

        const bool automatic_pruning{chainman.m_blockman.GetPruneTarget() != BlockManager::PRUNE_TARGET_MANUAL};
        obj.pushKV("automatic_pruning",  automatic_pruning);
        if (automatic_pruning) {
            obj.pushKV("prune_target_size", chainman.m_blockman.GetPruneTarget());
        }
    }

    NodeContext& node = EnsureAnyNodeContext(request.context);
    obj.pushKV("warnings", node::GetWarningsForRpc(*CHECK_NONFATAL(node.warnings), IsDeprecatedRPCEnabled("warnings")));
    return obj;
},
    };
}